

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

size_t slang::parsing::getExtraSize(TokenKind kind)

{
  size_t align;
  size_t size;
  TokenKind kind_local;
  
  if (kind == SystemIdentifier) {
    size = 4;
    goto LAB_00392f51;
  }
  if (kind == StringLiteral) {
LAB_00392f04:
    size = 0x10;
  }
  else {
    if (kind == IntegerLiteral) {
      size = 0x10;
      goto LAB_00392f51;
    }
    if (kind == UnbasedUnsizedLiteral) {
      size = 1;
      goto LAB_00392f51;
    }
    if ((ushort)(kind - RealLiteral) < 2) {
      size = 8;
      goto LAB_00392f51;
    }
    if (kind != Directive) {
      if (kind == IncludeFileName) goto LAB_00392f04;
      if (kind != MacroUsage) {
        return 0;
      }
    }
    size = 4;
  }
LAB_00392f51:
  return size + 7 & 0xfffffffffffffff8;
}

Assistant:

static constexpr size_t getExtraSize(TokenKind kind) {
    size_t size = 0;
    switch (kind) {
        case TokenKind::StringLiteral:
        case TokenKind::IncludeFileName:
            size = sizeof(std::string_view);
            break;
        case TokenKind::RealLiteral:
        case TokenKind::TimeLiteral:
            size = sizeof(double);
            break;
        case TokenKind::IntegerLiteral:
            size = sizeof(SVIntStorage);
            break;
        case TokenKind::UnbasedUnsizedLiteral:
            size = sizeof(logic_t);
            break;
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
            size = sizeof(SyntaxKind);
            break;
        case TokenKind::SystemIdentifier:
            size = sizeof(KnownSystemName);
            break;
        default:
            return 0;
    }

    size_t align = alignof(void*);
    return (size + align - 1) & ~(align - 1);
}